

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_280_8_fcbf97e8_for_proto *pp;
  int *piVar1;
  byte *pbVar2;
  undefined1 *puVar3;
  char cVar4;
  uchar uVar5;
  FTP *pFVar6;
  FILEPROTO *pFVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  curl_trc_feat *pcVar11;
  ConnectBits CVar12;
  undefined8 uVar13;
  proxy_info *ppVar14;
  _Bool _Var15;
  CURLcode CVar16;
  int iVar17;
  void *pvVar18;
  size_t sVar19;
  time_t tVar20;
  char *pcVar21;
  char *pcVar22;
  byte bVar23;
  ftpstate fVar24;
  ftpport fcmd;
  size_t sVar25;
  curl_off_t cVar26;
  connectdata *pcVar27;
  ip_quadruple *piVar28;
  size_t *in_R8;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int i;
  uint uVar33;
  long lVar34;
  Curl_dns_entry *dns;
  ulong local_198;
  int ftpcode;
  curl_off_t filesize;
  uint local_180;
  uint local_17c;
  int local_178;
  int local_174;
  int local_170;
  connectdata *local_150;
  size_t nread;
  undefined4 local_140 [2];
  curl_off_t size;
  undefined8 uStack_130;
  size_t local_128;
  
  nread = 0;
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar16 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar16;
  }
  CVar16 = ftp_readresp(data,(int)pp,(pingpong *)&ftpcode,(int *)&nread,in_R8);
  if (CVar16 != CURLE_OK) {
    return CVar16;
  }
  if (ftpcode == 0) {
    return CURLE_OK;
  }
  fVar24 = (conn->proto).ftpc.state;
  switch(fVar24) {
  case '\x01':
    if (ftpcode == 0xdc) {
      if ((data->set).use_ssl == '\0') goto LAB_0012a97e;
    }
    else {
      if (ftpcode != 0xe6) {
        Curl_failf(data,"Got a %03d ftp-server response when 220 was expected");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (((data->set).use_ssl < 2) || (((conn->bits).field_0x2 & 4) != 0)) {
        ftpcode = 0xe6;
        goto LAB_00129a53;
      }
    }
    if (((conn->bits).field_0x2 & 4) != 0) {
LAB_0012a97e:
      CVar16 = ftp_state_user(data,conn);
      return CVar16;
    }
    (conn->proto).ftpc.count3 = 0;
    bVar23 = (data->set).ftpsslauth;
    if (2 < bVar23) {
      Curl_failf(data,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d");
      return CURLE_UNKNOWN_OPTION;
    }
    iVar17 = *(int *)(&DAT_00174990 + (uint)bVar23 * 4);
    lVar34 = *(long *)(&DAT_001749a0 + (ulong)(uint)bVar23 * 8);
    (conn->proto).ftpc.count2 = *(int *)(&DAT_00174984 + (uint)bVar23 * 4);
    (conn->proto).ftpc.count1 = iVar17;
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s",ftp_statemachine::ftpauth[lVar34]);
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    fVar24 = '\x02';
    goto LAB_0012ab7c;
  case '\x02':
    if ((conn->proto).ftpc.pp.overflow != 0) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if ((ftpcode == 0x14e) || (ftpcode == 0xea)) {
      _Var15 = Curl_conn_is_ssl(conn,0);
      if ((!_Var15) && (CVar16 = Curl_ssl_cfilter_add(data,conn,0), CVar16 != CURLE_OK)) {
        return CURLE_USE_SSL_FAILED;
      }
      CVar16 = Curl_conn_connect(data,0,true,(_Bool *)&size);
      if (CVar16 != CURLE_OK) {
        return CVar16;
      }
      conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffff9ffff | 0x40000);
      goto LAB_0012a97e;
    }
    iVar17 = (conn->proto).ftpc.count3;
    if (0 < iVar17) {
      if (1 < (data->set).use_ssl) {
        return CURLE_USE_SSL_FAILED;
      }
      goto LAB_0012a97e;
    }
    (conn->proto).ftpc.count3 = iVar17 + 1;
    lVar34 = (long)(conn->proto).ftpc.count1 + (long)(conn->proto).ftpc.count2;
    (conn->proto).ftpc.count1 = (int)lVar34;
    pcVar21 = ftp_statemachine::ftpauth[lVar34];
    pcVar22 = "AUTH %s";
    goto LAB_0012a0b4;
  case '\x03':
  case '\x04':
LAB_00129a53:
    CVar16 = ftp_state_user_resp(data,ftpcode);
    break;
  case '\x05':
    if (ftpcode == 0xe6) {
      CVar16 = ftp_state_loggedin(data);
    }
    else {
      Curl_failf(data,"ACCT rejected by server: %03d");
      CVar16 = CURLE_FTP_WEIRD_PASS_REPLY;
    }
    break;
  case '\x06':
    uVar13 = 0x50;
    if ((data->set).use_ssl == '\x02') {
      uVar13 = 0x43;
    }
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"PROT %c",uVar13);
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    fVar24 = '\a';
    goto LAB_0012ab7c;
  case '\a':
    bVar23 = (data->set).use_ssl;
    if (ftpcode - 200U < 100) {
      conn->bits = (ConnectBits)
                   ((ulong)conn->bits & 0xfffffffffffdffff | (ulong)(bVar23 != 2) << 0x11);
    }
    else if (2 < bVar23) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((data->set).ftp_ccc == '\0') goto LAB_0012a321;
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","CCC");
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    fVar24 = '\b';
    goto LAB_0012ab7c;
  case '\b':
    if ((ftpcode < 500) &&
       (CVar16 = Curl_ssl_cfilter_remove(data,0,(data->set).ftp_ccc == '\x02'), CVar16 != CURLE_OK))
    {
      Curl_failf(data,"Failed to clear the command channel (CCC)");
      return CVar16;
    }
LAB_0012a321:
    CVar16 = ftp_state_pwd(data,conn);
    break;
  case '\t':
    if (ftpcode == 0x101) {
      pcVar21 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
      Curl_dyn_init((dynbuf *)&size,1000);
      for (pcVar21 = pcVar21 + 4; (cVar4 = *pcVar21, cVar4 != '\0' && (cVar4 != '\n'));
          pcVar21 = pcVar21 + 1) {
        if (cVar4 == '\"') goto LAB_0012a8df;
      }
LAB_0012acac:
      Curl_dyn_free((dynbuf *)&size);
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 || (0 < pcVar11->log_level)
          ))) {
        Curl_infof(data,"Failed to figure out path");
      }
    }
    goto LAB_0012ace7;
  case '\n':
    if (ftpcode == 0xd7) {
      pcVar21 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
      pcVar21 = pcVar21 + 3;
      do {
        pcVar22 = pcVar21;
        bVar23 = pcVar22[1];
        pcVar21 = pcVar22 + 1;
      } while (bVar23 == 0x20);
      sVar25 = 0;
      while ((bVar23 & 0xdf) != 0) {
        lVar34 = sVar25 + 2;
        sVar25 = sVar25 + 1;
        bVar23 = pcVar22[lVar34];
      }
      pcVar21 = (char *)Curl_memdup0(pcVar22 + 1,sVar25);
      if (pcVar21 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      iVar17 = curl_strequal(pcVar21,"OS/400");
      if (iVar17 != 0) {
        CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","SITE NAMEFMT 1");
        if (CVar16 != CURLE_OK) {
          (*Curl_cfree)(pcVar21);
          return CVar16;
        }
        (*Curl_cfree)((conn->proto).ftpc.server_os);
        (conn->proto).ftpc.server_os = pcVar21;
        fVar24 = '\v';
        goto LAB_0012ab7c;
      }
      (*Curl_cfree)((conn->proto).ftpc.server_os);
      (conn->proto).ftpc.server_os = pcVar21;
    }
    goto LAB_0012ace7;
  case '\v':
    if (ftpcode == 0xfa) {
      ftp_state_pwd(data,conn);
      return CURLE_OK;
    }
LAB_0012ace7:
    CVar16 = CURLE_OK;
    _ftp_state(data,'\0');
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 || (0 < pcVar11->log_level))
        )) && (0 < Curl_trc_feat_ftp.log_level)) {
      if (data->conn == (connectdata *)0x0) {
        pcVar21 = "???";
      }
      else {
        pcVar21 = ftp_state_names[(data->conn->proto).ftpc.state];
      }
      CVar16 = CURLE_OK;
      Curl_trc_ftp(data,"[%s] protocol connect phase DONE",pcVar21);
    }
    break;
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
    if ((ftpcode < 400) || ((conn->proto).ftpc.count2 != 0)) {
      CVar16 = ftp_state_quote(data,false,fVar24);
    }
    else {
      Curl_failf(data,"QUOT command failed with %03d");
      CVar16 = CURLE_QUOTE_ERROR;
    }
    break;
  case '\x10':
    if (ftpcode - 200U < 100) {
      (conn->proto).ftpc.count2 = 0;
      iVar17 = (conn->proto).ftpc.cwdcount;
      (conn->proto).ftpc.cwdcount = iVar17 + 1;
      if ((conn->proto).ftpc.dirdepth <= iVar17) {
        CVar16 = ftp_state_mdtm(data);
        return CVar16;
      }
      pcVar21 = (conn->proto).ftpc.dirs[iVar17];
      goto LAB_0012a0ad;
    }
    uVar5 = (data->set).ftp_create_missing_dirs;
    if (((uVar5 == '\0') || (lVar34 = (long)(conn->proto).ftpc.cwdcount, lVar34 == 0)) ||
       ((conn->proto).ftpc.count2 != 0)) {
      Curl_failf(data,"Server denied you to change to the given directory");
      pbVar2 = (byte *)((long)&conn->proto + 0x112);
      *pbVar2 = *pbVar2 | 0x10;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    (conn->proto).ftpc.count2 = 1;
    *(uint *)((long)&conn->proto + 0x108) = (uint)(uVar5 == '\x02');
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"MKD %s",(conn->proto).ftpc.dirs[lVar34 + -1]);
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    fVar24 = '\x11';
    goto LAB_0012ab7c;
  case '\x11':
    if (99 < ftpcode - 200U) {
      piVar1 = &(conn->proto).ftpc.count3;
      iVar17 = *piVar1;
      *piVar1 = *piVar1 + -1;
      if (iVar17 == 0) {
        Curl_failf(data,"Failed to MKD dir: %03d");
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    }
    _ftp_state(data,'\x10');
    pcVar21 = (conn->proto).ftpc.dirs[(long)(conn->proto).ftpc.cwdcount + -1];
LAB_0012a0ad:
    pcVar22 = "CWD %s";
LAB_0012a0b4:
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,pcVar22,pcVar21);
    break;
  case '\x12':
    pFVar7 = (data->req).p.file;
    if (ftpcode == 0x226) {
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 || (0 < pcVar11->log_level)
          ))) {
        pcVar21 = "MDTM failed: file does not exist or permission problem, continuing";
LAB_0012a65f:
        Curl_infof(data,pcVar21);
      }
    }
    else if (ftpcode == 0xd5) {
      pcVar27 = data->conn;
      pcVar21 = Curl_dyn_ptr(&(pcVar27->proto).ftpc.pp.recvbuf);
      sVar19 = strlen(pcVar21 + 4);
      if ((((0xd < sVar19) && (uVar33 = pcVar21[9] + -0x210 + pcVar21[8] * 10, (int)uVar33 < 0xd))
          && (uVar29 = pcVar21[0xb] + -0x210 + pcVar21[10] * 10, (int)uVar29 < 0x20)) &&
         (((uVar30 = pcVar21[0xd] + -0x210 + pcVar21[0xc] * 10, (int)uVar30 < 0x18 &&
           (uVar31 = pcVar21[0xf] + -0x210 + pcVar21[0xe] * 10, (int)uVar31 < 0x3c)) &&
          (uVar32 = pcVar21[0x11] + -0x210 + pcVar21[0x10] * 10, (int)uVar32 < 0x3d)))) {
        curl_msnprintf((char *)&size,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",
                       (ulong)((((int)pcVar21[5] + pcVar21[4] * 10) * 100 +
                               (int)pcVar21[7] + pcVar21[6] * 10) - 0xd050),(ulong)uVar33,
                       (ulong)uVar29,(ulong)uVar30,(ulong)uVar31,(ulong)uVar32);
        tVar20 = Curl_getdate_capped((char *)&size);
        (data->info).filetime = tVar20;
      }
      if (((((data->req).field_0xd3 & 2) != 0) && ((pcVar27->proto).ftpc.file != (char *)0x0)) &&
         ((((data->set).field_0x89d & 4) != 0 && (lVar34 = (data->info).filetime, -1 < lVar34)))) {
        CVar16 = Curl_gmtime(lVar34,(tm *)&filesize);
        if (CVar16 != CURLE_OK) {
          return CVar16;
        }
        iVar17 = 6;
        if (local_170 != 0) {
          iVar17 = local_170 + -1;
        }
        iVar17 = curl_msnprintf((char *)&size,0x80,
                                "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                                Curl_wkday[iVar17],(ulong)local_17c,Curl_month[local_178],
                                (ulong)(local_174 + 0x76c),(ulong)local_180,(ulong)filesize >> 0x20,
                                filesize & 0xffffffff);
        CVar16 = client_write_header(data,(char *)&size,(long)iVar17);
        if (CVar16 != CURLE_OK) {
          return CVar16;
        }
      }
    }
    else if ((((data->set).field_0x89f & 0x40) != 0) &&
            ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
             (0 < pcVar11->log_level)))) {
      pcVar21 = "unsupported MDTM reply format";
      goto LAB_0012a65f;
    }
    uVar5 = (data->set).timecondition;
    if (uVar5 != '\0') {
      uVar9 = (data->info).filetime;
      if (((long)uVar9 < 1) || (uVar10 = (data->set).timevalue, (long)uVar10 < 1)) {
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
            (0 < pcVar11->log_level)))) {
          Curl_infof(data,"Skipping time comparison");
        }
      }
      else if (uVar5 == '\x02') {
        if (uVar10 < uVar9) {
          if ((((data->set).field_0x89f & 0x40) != 0) &&
             ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
              (0 < pcVar11->log_level)))) {
            pcVar21 = "The requested document is not old enough";
LAB_0012ab5b:
            Curl_infof(data,pcVar21);
          }
LAB_0012ab65:
          pFVar7->fd = 2;
          puVar3 = &(data->info).field_0xf4;
          *puVar3 = *puVar3 | 1;
          goto switchD_0012994b_default;
        }
      }
      else if (uVar9 <= uVar10) {
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
            (0 < pcVar11->log_level)))) {
          pcVar21 = "The requested document is not new enough";
          goto LAB_0012ab5b;
        }
        goto LAB_0012ab65;
      }
    }
    CVar16 = ftp_state_type(data);
    break;
  case '\x13':
  case '\x14':
  case '\x15':
  case '\x16':
    CVar16 = ftp_state_type_resp(data,ftpcode,fVar24);
    break;
  case '\x17':
  case '\x18':
  case '\x19':
    filesize = -1;
    pcVar21 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
    if (ftpcode == 0xd5) {
      pcVar21 = pcVar21 + 4;
      pvVar18 = memchr(pcVar21,0xd,(data->conn->proto).ftpc.pp.nfinal);
      size = (curl_off_t)pcVar21;
      if (pvVar18 != (void *)0x0) {
        pcVar22 = (char *)((long)pvVar18 + -1);
        if (*(char *)((long)pvVar18 + -1) == '\n') {
          pcVar22 = (char *)((long)pvVar18 + -2);
        }
        do {
          size = (curl_off_t)pcVar22;
          if ((ulong)size <= pcVar21) break;
          pcVar22 = (char *)(size + -1);
        } while ((byte)(*(char *)(size + -1) - 0x30U) < 10);
      }
      iVar17 = Curl_str_number((char **)&size,&filesize,0x7fffffffffffffff);
      if (iVar17 != 0) {
        filesize = -1;
      }
    }
    else if (fVar24 != '\x19' && ftpcode == 0x226) {
      Curl_failf(data,"The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    if (fVar24 == '\x19') {
      (data->state).resume_from = filesize;
      CVar16 = ftp_state_ul_setup(data,true);
    }
    else if (fVar24 == '\x18') {
      Curl_pgrsSetDownloadSize(data,filesize);
      CVar16 = ftp_state_retr(data,filesize);
    }
    else {
      CVar16 = CURLE_OK;
      if (fVar24 == '\x17') {
        if (filesize == -1) {
          cVar26 = -1;
        }
        else {
          iVar17 = curl_msnprintf((char *)&size,0x80,"Content-Length: %ld\r\n");
          CVar16 = client_write_header(data,(char *)&size,(long)iVar17);
          cVar26 = filesize;
          if (CVar16 != CURLE_OK) {
            return CVar16;
          }
        }
        Curl_pgrsSetDownloadSize(data,cVar26);
        CVar16 = ftp_state_rest(data,data->conn);
      }
    }
    break;
  case '\x1a':
  case '\x1b':
    if (fVar24 != '\x1b') {
      if (ftpcode == 0x15e) {
        size._0_1_ = 'A';
        size._1_1_ = 'c';
        size._2_1_ = 'c';
        size._3_1_ = 'e';
        size._4_1_ = 'p';
        size._5_1_ = 't';
        size._6_1_ = '-';
        size._7_1_ = 'r';
        uStack_130._0_1_ = 'a';
        uStack_130._1_1_ = 'n';
        uStack_130._2_1_ = 'g';
        uStack_130._3_1_ = 'e';
        uStack_130._4_1_ = 's';
        uStack_130._5_1_ = ':';
        uStack_130._6_1_ = ' ';
        uStack_130._7_1_ = 'b';
        local_128 = 0xa0d73657479;
        sVar19 = strlen((char *)&size);
        CVar16 = client_write_header(data,(char *)&size,sVar19);
        if (CVar16 != CURLE_OK) {
          return CVar16;
        }
      }
      CVar16 = ftp_state_prepare_transfer(data);
      return CVar16;
    }
    if (ftpcode != 0x15e) {
      Curl_failf(data,"Couldn\'t use REST");
      return CURLE_FTP_COULDNT_USE_REST;
    }
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(conn->proto).ftpc.file);
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    fVar24 = ' ';
    goto LAB_0012ab7c;
  case '\x1c':
    if (ftpcode - 200U < 100) {
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 || (0 < pcVar11->log_level)
          ))) {
        Curl_infof(data,"Connect data stream actively");
      }
      _ftp_state(data,'\0');
      CVar16 = ftp_dophase_done(data,false);
    }
    else {
      pcVar27 = data->conn;
      iVar17 = (pcVar27->proto).ftpc.count1;
      if (iVar17 == 0) {
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
            (0 < pcVar11->log_level)))) {
          Curl_infof(data,"disabling EPRT usage");
        }
        puVar3 = &(pcVar27->bits).field_0x2;
        *puVar3 = *puVar3 & 0xfe;
        fcmd = PORT;
      }
      else {
        fcmd = iVar17 + PORT;
        if (fcmd == DONE) {
          Curl_failf(data,"Failed to do PORT");
          return CURLE_FTP_PORT_FAILED;
        }
      }
      CVar16 = ftp_state_use_port(data,fcmd);
    }
    break;
  case '\x1d':
    if (ftpcode == 200) {
      CVar16 = ftp_state_use_pasv(data,conn);
    }
    else {
      Curl_failf(data,"PRET command not accepted: %03d");
      CVar16 = CURLE_FTP_PRET_FAILED;
    }
    break;
  case '\x1e':
    pcVar27 = data->conn;
    dns = (Curl_dns_entry *)0x0;
    local_198 = (ulong)(uint)ftpcode;
    pcVar21 = Curl_dyn_ptr(&(pcVar27->proto).ftpc.pp.recvbuf);
    pcVar21 = pcVar21 + 4;
    (*Curl_cfree)((pcVar27->proto).ftpc.newhost);
    (pcVar27->proto).ftpc.newhost = (char *)0x0;
    iVar17 = (pcVar27->proto).ftpc.count1;
    if ((int)local_198 == 0xe5 && iVar17 == 0) {
      pcVar21 = strchr(pcVar21,0x28);
      if ((((pcVar21 == (char *)0x0) || (cVar4 = pcVar21[1], pcVar21[2] != cVar4)) ||
          (pcVar21[3] != cVar4)) || (9 < (byte)(pcVar21[4] - 0x30U))) {
        pcVar21 = "Weirdly formatted EPSV reply";
      }
      else {
        size = (curl_off_t)(pcVar21 + 4);
        iVar17 = Curl_str_number((char **)&size,&filesize,0xffff);
        if ((iVar17 == 0) && (*(char *)size == cVar4)) {
          (pcVar27->proto).ftpc.newport = (unsigned_short)filesize;
          if (((ulong)pcVar27->bits & 10) == 0) {
            piVar28 = &pcVar27->primary;
          }
          else {
            piVar28 = (ip_quadruple *)(pcVar27->host).name;
          }
          pcVar21 = (*Curl_cstrdup)(piVar28->remote_ip);
          (pcVar27->proto).ftpc.newhost = pcVar21;
          if (pcVar21 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
LAB_0012adaa:
          CVar12 = pcVar27->bits;
          if (((ulong)CVar12 & 0x10) == 0) {
            if (((CVar12._0_4_ & 0x800040) == 0x800000) && (*pcVar21 == '\0')) {
              (*Curl_cfree)(pcVar21);
              if (((ulong)pcVar27->bits & 10) == 0) {
                piVar28 = &pcVar27->primary;
              }
              else {
                piVar28 = (ip_quadruple *)(pcVar27->host).name;
              }
              pcVar21 = (*Curl_cstrdup)(piVar28->remote_ip);
              (pcVar27->proto).ftpc.newhost = pcVar21;
              if (pcVar21 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            Curl_resolv_blocking
                      (data,pcVar21,(uint)(pcVar27->proto).ftpc.newport,(uint)pcVar27->ip_version,
                       &dns);
            uVar33 = (uint)(pcVar27->proto).ftpc.newport;
            if (dns == (Curl_dns_entry *)0x0) {
              Curl_failf(data,"cannot resolve new host %s:%hu",(pcVar27->proto).ftpc.newhost,
                         (ulong)uVar33);
              return CURLE_FTP_CANT_GET_HOST;
            }
          }
          else {
            ppVar14 = &pcVar27->socks_proxy;
            if (((ulong)CVar12 & 2) == 0) {
              ppVar14 = &pcVar27->http_proxy;
            }
            pcVar21 = (ppVar14->host).name;
            Curl_resolv_blocking
                      (data,pcVar21,(pcVar27->primary).remote_port,(uint)pcVar27->ip_version,&dns);
            uVar33 = (pcVar27->primary).remote_port;
            if (dns == (Curl_dns_entry *)0x0) {
              Curl_failf(data,"cannot resolve proxy host %s:%hu",pcVar21,(ulong)(uVar33 & 0xffff));
              return CURLE_COULDNT_RESOLVE_PROXY;
            }
          }
          CVar16 = Curl_conn_setup(data,pcVar27,1,dns,*(uint *)&pcVar27->bits >> 0x11 & 1);
          if (CVar16 != CURLE_OK) {
            Curl_resolv_unlink(data,&dns);
            if ((int)local_198 != 0xe5) {
              return CVar16;
            }
            if ((pcVar27->proto).ftpc.count1 != 0) {
              return CVar16;
            }
            goto LAB_0012a9de;
          }
          if (((data->set).field_0x89f & 0x40) != 0) {
            pcVar21 = (pcVar27->proto).ftpc.newhost;
            Curl_printable_address(dns->addr,(char *)&size,0x100);
            if ((((data->set).field_0x89f & 0x40) != 0) &&
               ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
                (0 < pcVar11->log_level)))) {
              Curl_infof(data,"Connecting to %s (%s) port %d",pcVar21,&size,(ulong)(uVar33 & 0xffff)
                        );
            }
          }
          Curl_resolv_unlink(data,&dns);
          (*Curl_cfree)(pcVar27->secondaryhostname);
          pcVar27->secondary_port = (pcVar27->proto).ftpc.newport;
          pcVar21 = (*Curl_cstrdup)((pcVar27->proto).ftpc.newhost);
          pcVar27->secondaryhostname = pcVar21;
          if (pcVar21 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          puVar3 = &(pcVar27->bits).field_0x1;
          *puVar3 = *puVar3 | 0x10;
          goto switchD_0012994b_default;
        }
        pcVar21 = "Illegal port number in EPSV reply";
      }
      Curl_failf(data,pcVar21);
    }
    else {
      if ((int)local_198 == 0xe3 && iVar17 == 1) {
        local_150 = pcVar27;
LAB_0012a3c5:
        if (*pcVar21 == '\0') {
LAB_0012a9c0:
          Curl_failf(data,"Couldn\'t interpret the 227-response");
          return CURLE_FTP_WEIRD_227_FORMAT;
        }
        lVar34 = 0;
        filesize = (curl_off_t)pcVar21;
        do {
          pcVar27 = local_150;
          if (lVar34 == 6) {
            if (*pcVar21 == '\0') goto LAB_0012a9c0;
            uVar33 = (uint)*(undefined8 *)&(data->set).field_0x89c;
            if ((uVar33 >> 0x13 & 1) == 0) {
              pcVar21 = curl_maprintf("%u.%u.%u.%u",size & 0xffffffff,(ulong)size._4_4_,
                                      uStack_130 & 0xffffffff,(ulong)uStack_130._4_4_);
              pcVar27 = local_150;
            }
            else {
              if (((uVar33 >> 0x1e & 1) != 0) &&
                 ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar11->log_level)))) {
                Curl_infof(data,"Skip %u.%u.%u.%u for data connection, reuse %s instead",
                           size & 0xffffffff,(ulong)size._4_4_,uStack_130 & 0xffffffff,
                           (ulong)uStack_130._4_4_,(local_150->host).name);
              }
              if (((ulong)pcVar27->bits & 10) == 0) {
                piVar28 = &pcVar27->primary;
              }
              else {
                piVar28 = (ip_quadruple *)(pcVar27->host).name;
              }
              pcVar21 = (*Curl_cstrdup)(piVar28->remote_ip);
            }
            (pcVar27->proto).ftpc.newhost = pcVar21;
            if (pcVar21 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            (pcVar27->proto).ftpc.newport =
                 (short)((int)local_128 << 8) + (short)(local_128 >> 0x20);
            goto LAB_0012adaa;
          }
          if (lVar34 != 0) {
            if (*(char *)filesize != ',') goto LAB_0012a41b;
            filesize = filesize + 1;
          }
          iVar17 = Curl_str_number((char **)&filesize,(curl_off_t *)local_140,0xff);
          if (iVar17 != 0) goto LAB_0012a41b;
          *(undefined4 *)((long)&size + lVar34 * 4) = local_140[0];
          lVar34 = lVar34 + 1;
        } while( true );
      }
      if (iVar17 == 0) {
LAB_0012a9de:
        CVar16 = ftp_epsv_disable(data,pcVar27);
        return CVar16;
      }
      Curl_failf(data,"Bad PASV/EPSV response: %03d",local_198);
    }
    CVar16 = CURLE_FTP_WEIRD_PASV_REPLY;
    break;
  case '\x1f':
  case ' ':
    pcVar27 = data->conn;
    pFVar6 = (data->req).p.ftp;
    if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
      size = -1;
      if ((fVar24 == '\x1f') ||
         (((((data->state).field_0x7bf & 0x40) != 0 || (((data->set).field_0x8a0 & 8) != 0)) ||
          (0 < pFVar6->downloadsize)))) {
        lVar34 = pFVar6->downloadsize;
        cVar26 = lVar34;
        if (lVar34 < 0) {
          lVar34 = -1;
          cVar26 = size;
        }
      }
      else {
        pcVar21 = Curl_dyn_ptr(&(pcVar27->proto).ftpc.pp.recvbuf);
        pcVar22 = strstr(pcVar21," bytes");
        lVar34 = -1;
        cVar26 = size;
        if (pcVar22 != (char *)0x0) {
          pcVar21 = pcVar21 + (2 - (long)pcVar22);
          for (; (pcVar21 != (char *)0x0 && (pcVar22[-1] != '(')); pcVar22 = pcVar22 + -1) {
            if (9 < (byte)(pcVar22[-1] - 0x30U)) goto LAB_0012a424;
            filesize = (curl_off_t)(pcVar22 + -2);
            pcVar21 = pcVar21 + 1;
          }
          filesize = (curl_off_t)pcVar22;
          iVar17 = Curl_str_number((char **)&filesize,&size,0x7fffffffffffffff);
          lVar34 = size;
          cVar26 = size;
          if (iVar17 != 0) {
            size = 1;
            lVar34 = 1;
            cVar26 = size;
          }
        }
      }
LAB_0012a424:
      size = cVar26;
      lVar8 = (data->req).maxdownload;
      if (lVar8 < 1 || lVar34 <= lVar8) {
        if ((fVar24 != '\x1f') && (((data->state).field_0x7bf & 0x40) != 0)) {
          size = -1;
        }
      }
      else {
        (data->req).size = lVar8;
        size = lVar8;
      }
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 || (0 < pcVar11->log_level)
          ))) {
        Curl_infof(data,"Maxdownload = %ld");
      }
      if (((fVar24 != '\x1f') && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 || (0 < pcVar11->log_level)
          ))) {
        Curl_infof(data,"Getting file with size: %ld",size);
      }
      (pcVar27->proto).ftpc.state_saved = fVar24;
      (pcVar27->proto).ftpc.retr_size_saved = size;
      if (((data->set).field_0x89d & 0x80) != 0) {
        CVar16 = Curl_conn_connect(data,1,false,(_Bool *)&filesize);
        if (CVar16 != CURLE_OK) {
          return CVar16;
        }
        if ((char)filesize == '\0') {
          if ((((data->set).field_0x89f & 0x40) != 0) &&
             ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
              (0 < pcVar11->log_level)))) {
            Curl_infof(data,"Data conn was not available immediately");
          }
          _ftp_state(data,'\0');
          pbVar2 = (byte *)((long)&pcVar27->proto + 0x112);
          *pbVar2 = *pbVar2 | 0x20;
          goto LAB_0012abba;
        }
        pbVar2 = (byte *)((long)&pcVar27->proto + 0x112);
        *pbVar2 = *pbVar2 & 0xdf;
      }
      goto LAB_0012a4df;
    }
    if (ftpcode != 0x1c2 || fVar24 != '\x1f') {
      Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
      CVar16 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (fVar24 != ' ') {
        CVar16 = CURLE_FTP_COULDNT_RETR_FILE;
      }
      if (ftpcode != 0x226) {
        return CURLE_FTP_COULDNT_RETR_FILE;
      }
      return CVar16;
    }
    pFVar6->transfer = PPTRANSFER_NONE;
  default:
switchD_0012994b_default:
    fVar24 = '\0';
LAB_0012ab7c:
    CVar16 = CURLE_OK;
    _ftp_state(data,fVar24);
    break;
  case '!':
    if (399 < ftpcode) {
      Curl_failf(data,"Failed FTP upload: %0d");
      _ftp_state(data,'\0');
      return CURLE_UPLOAD_FAILED;
    }
    pcVar27 = data->conn;
    (pcVar27->proto).ftpc.state_saved = '!';
    if (((data->set).field_0x89d & 0x80) != 0) {
      _ftp_state(data,'\0');
      CVar16 = Curl_conn_connect(data,1,false,(_Bool *)&size);
      if (CVar16 != CURLE_OK) {
        return CVar16;
      }
      if ((char)size == '\0') {
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
            (0 < pcVar11->log_level)))) {
          Curl_infof(data,"Data conn was not available immediately");
        }
        pbVar2 = (byte *)((long)&pcVar27->proto + 0x112);
        *pbVar2 = *pbVar2 | 0x20;
LAB_0012abba:
        CVar16 = ftp_check_ctrl_on_data_wait(data);
        return CVar16;
      }
      pbVar2 = (byte *)((long)&pcVar27->proto + 0x112);
      *pbVar2 = *pbVar2 & 0xdf;
    }
LAB_0012a4df:
    CVar16 = InitiateTransfer(data);
  }
  return CVar16;
LAB_0012a41b:
  pcVar21 = pcVar21 + 1;
  goto LAB_0012a3c5;
LAB_0012a8df:
  if (pcVar21[1] == '\"') {
    if (pcVar21[2] != '\"') {
      sVar25 = Curl_dyn_len((dynbuf *)&size);
      if (sVar25 == 0) goto LAB_0012acac;
      pcVar21 = Curl_dyn_ptr((dynbuf *)&size);
      if (((conn->proto).ftpc.server_os == (char *)0x0) && (*pcVar21 != '/')) {
        CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","SYST");
        if (CVar16 != CURLE_OK) {
          (*Curl_cfree)(pcVar21);
          return CVar16;
        }
        (*Curl_cfree)((conn->proto).ftpc.entrypath);
        (conn->proto).ftpc.entrypath = pcVar21;
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
            (0 < pcVar11->log_level)))) {
          Curl_infof(data,"Entry path is \'%s\'",pcVar21);
        }
        (*Curl_cfree)((data->state).most_recent_ftp_entrypath);
        pcVar21 = (*Curl_cstrdup)((conn->proto).ftpc.entrypath);
        (data->state).most_recent_ftp_entrypath = pcVar21;
        if (pcVar21 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        _ftp_state(data,'\n');
        return CURLE_OK;
      }
      (*Curl_cfree)((conn->proto).ftpc.entrypath);
      (conn->proto).ftpc.entrypath = pcVar21;
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 || (0 < pcVar11->log_level)
          ))) {
        Curl_infof(data,"Entry path is \'%s\'",pcVar21);
      }
      (*Curl_cfree)((data->state).most_recent_ftp_entrypath);
      pcVar21 = (*Curl_cstrdup)((conn->proto).ftpc.entrypath);
      (data->state).most_recent_ftp_entrypath = pcVar21;
      if (pcVar21 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      goto LAB_0012ace7;
    }
    pcVar21 = pcVar21 + 2;
  }
  else {
    if (pcVar21[1] == '\0') goto LAB_0012acac;
    pcVar21 = pcVar21 + 1;
  }
  CVar16 = Curl_dyn_addn((dynbuf *)&size,pcVar21,1);
  if (CVar16 != CURLE_OK) {
    return CVar16;
  }
  goto LAB_0012a8df;
}

Assistant:

static CURLcode ftp_statemachine(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result;
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char * const ftpauth[] = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  result = ftp_readresp(data, FIRSTSOCKET, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230) {
        /* 230 User logged in - already! Take as 220 if TLS required. */
        if(data->set.use_ssl <= CURLUSESSL_TRY ||
           conn->bits.ftp_use_control_ssl)
          return ftp_state_user_resp(data, ftpcode);
      }
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(data, conn)) {
          failf(data, "secure login failed");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        infof(data, "Authentication successful");
      }
#endif

      if(data->set.use_ssl && !conn->bits.ftp_use_control_ssl) {
        /* We do not have a SSL/TLS control connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we do not know what to do */
        }
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        if(!result)
          ftp_state(data, FTP_AUTH);
      }
      else
        result = ftp_state_user(data, conn);
      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      if(pp->overflow)
        return CURLE_WEIRD_SERVER_REPLY; /* Forbid pipelining in response. */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* this was BLOCKING, keep it so for now */
        bool done;
        if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
          result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
          if(result) {
            /* we failed and bail out */
            return CURLE_USE_SSL_FAILED;
          }
        }
        result = Curl_conn_connect(data, FIRSTSOCKET, TRUE, &done);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          conn->bits.ftp_use_control_ssl = TRUE; /* SSL on control */
          result = ftp_state_user(data, conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(data, conn);
      }
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(data, ftpcode);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(data, ftpcode);
      break;

    case FTP_PBSZ:
      result =
        Curl_pp_sendf(data, &ftpc->pp, "PROT %c",
                      data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      if(!result)
        ftp_state(data, FTP_PROT);
      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL);
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        result = Curl_pp_sendf(data, &ftpc->pp, "%s", "CCC");
        if(!result)
          ftp_state(data, FTP_CCC);
      }
      else
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        /* This has only been tested on the proftpd server, and the mod_tls
         * code sends a close notify alert without waiting for a close notify
         * alert in response. Thus we wait for a close notify alert from the
         * server, but we do not send one. Let's hope other servers do
         * the same... */
        result = Curl_ssl_cfilter_remove(data, FIRSTSOCKET,
          (data->set.ftp_ccc == CURLFTPSSL_CCC_ACTIVE));

        if(result)
          failf(data, "Failed to clear the command channel (CCC)");
      }
      if(!result)
        /* Then continue as normal */
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first
                                                       letter */
        bool entry_extracted = FALSE;
        struct dynbuf out;
        Curl_dyn_init(&out, 1000);

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(*ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          for(ptr++; *ptr; ptr++) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                result = Curl_dyn_addn(&out, &ptr[1], 1);
                ptr++;
              }
              else {
                /* end of path */
                if(Curl_dyn_len(&out))
                  entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              result = Curl_dyn_addn(&out, ptr, 1);
            if(result)
              return result;
          }
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */
          char *dir = Curl_dyn_ptr(&out);

          if(!ftpc->server_os && dir[0] != '/') {
            result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            free(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            free(data->state.most_recent_ftp_entrypath);
            data->state.most_recent_ftp_entrypath = strdup(ftpc->entrypath);
            if(!data->state.most_recent_ftp_entrypath)
              return CURLE_OUT_OF_MEMORY;
            ftp_state(data, FTP_SYST);
            break;
          }

          free(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          free(data->state.most_recent_ftp_entrypath);
          data->state.most_recent_ftp_entrypath = strdup(ftpc->entrypath);
          if(!data->state.most_recent_ftp_entrypath)
            return CURLE_OUT_OF_MEMORY;
        }
        else {
          /* could not get the path */
          Curl_dyn_free(&out);
          infof(data, "Failed to figure out path");
        }
      }
      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      CURL_TRC_FTP(data, "[%s] protocol connect phase DONE", FTP_DSTATE(data));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first
                                                       letter */
        char *os;
        char *start;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(start = ptr; *ptr && *ptr != ' '; ptr++)
          ;
        os = Curl_memdup0(start, ptr - start);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Check for special servers here. */
        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          free(ftpc->server_os);
          ftpc->server_os = os;
          ftp_state(data, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        free(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      CURL_TRC_FTP(data, "[%s] protocol connect phase DONE", FTP_DSTATE(data));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(data, conn);
        break;
      }

      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      CURL_TRC_FTP(data, "[%s] protocol connect phase DONE", FTP_DSTATE(data));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(data, "QUOT command failed with %03d", ftpcode);
        result = CURLE_QUOTE_ERROR;
      }
      else
        result = ftp_state_quote(data, FALSE, ftpc->state);
      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */

          /* count3 is set to allow MKD to fail once per dir. In the case when
          CWD fails and then MKD fails (due to another session raced it to
          create the dir) this then allows for a second try to CWD to it. */
          ftpc->count3 = (data->set.ftp_create_missing_dirs == 2) ? 1 : 0;

          result = Curl_pp_sendf(data, &ftpc->pp, "MKD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
          if(!result)
            ftp_state(data, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* do not remember this path as we failed
                                   to enter it */
          result = CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth)
          /* send next CWD */
          result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
        else
          result = ftp_state_mdtm(data);
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        result = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        ftp_state(data, FTP_CWD);
        /* send CWD */
        result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                               ftpc->dirs[ftpc->cwdcount - 1]);
      }
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(data, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(data, conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(data, conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(data, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(data, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
    default:
      /* internal error */
      ftp_state(data, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}